

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ani2h264raw.cpp
# Opt level: O1

void parse(int argc,char **argv)

{
  uint *puVar1;
  uint uVar2;
  OptionAdder *pOVar3;
  size_t sVar4;
  OptionValue *pOVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source_00;
  ostream *poVar6;
  long *plVar7;
  long lVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  options_00;
  ParseResult result;
  Options options;
  path local_508;
  uint *local_4d8;
  pointer local_4d0;
  uint local_4c8;
  undefined4 uStack_4c4;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_498;
  undefined1 local_488 [32];
  _Alloc_hider local_468;
  size_type sStack_460;
  undefined1 local_458 [16];
  _Alloc_hider _Stack_448;
  __node_base local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_438;
  size_t sStack_428;
  __node_base_ptr local_420;
  element_type *local_418;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_410;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  pointer pbStack_400;
  pointer local_3f8;
  pointer pbStack_3f0;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  shared_ptr<const_cxxopts::Value> local_348;
  __node_base_ptr local_338;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_330;
  shared_ptr<const_cxxopts::Value> local_328;
  shared_ptr<const_cxxopts::Value> local_318;
  string local_308;
  string local_2e8;
  long *local_2c8 [2];
  long local_2b8 [2];
  string local_2a8;
  string local_288;
  undefined1 local_268 [20];
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_230;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  Options local_1a8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,*argv,(allocator<char> *)local_4b8);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8," - ani files to h264 bitstream converter","");
  cxxopts::Options::Options(&local_1a8,&local_288,&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"[optional args]","");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_1a8.m_positional_help,&local_1c8);
  local_1a8.m_show_positional = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  local_1a8.m_width = 0x46;
  local_1a8.m_tab_expansion = true;
  local_1a8.m_allow_unrecognised = true;
  local_4d8 = &local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"");
  uVar2 = local_4c8;
  local_4a8._0_8_ = local_4d0;
  puVar1 = (uint *)(local_268 + 0x10);
  if (local_4d8 == &local_4c8) {
    uStack_250 = uStack_4c0;
    uStack_24c = uStack_4bc;
    local_268._0_8_ = puVar1;
  }
  else {
    local_268._0_8_ = local_4d8;
  }
  uStack_254 = uStack_4c4;
  local_268._16_4_ = local_4c8;
  local_268._8_8_ = local_4d0;
  local_4d0 = (pointer)0x0;
  local_4c8 = local_4c8 & 0xffffff00;
  local_4b8._8_8_ = local_4a8 + 8;
  if ((uint *)local_268._0_8_ == puVar1) {
    local_4a8._8_8_ = CONCAT44(uStack_4c4,uVar2);
    aStack_498._4_4_ = uStack_24c;
    aStack_498._0_4_ = uStack_250;
  }
  else {
    local_4b8._8_8_ = local_268._0_8_;
    local_4a8._8_8_ = stack0xfffffffffffffda8;
  }
  local_4d8 = &local_4c8;
  local_4b8._0_8_ = &local_1a8;
  local_268._0_8_ = puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"i,input","");
  local_508._M_pathname._M_dataplus._M_p = (pointer)&local_508._M_pathname.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"Input","");
  cxxopts::value<std::__cxx11::string>();
  local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3f8;
  local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_3f0;
  local_3f8 = (pointer)0x0;
  pbStack_3f0 = (pointer)0x0;
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"ANI file","");
  pOVar3 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)local_4b8,(string *)local_268,&local_508._M_pathname,&local_318
                      ,&local_368);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"o,output","");
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"Output file","");
  cxxopts::value<std::__cxx11::string>();
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"out.h264","");
  (*(code *)local_338->_M_nxt[10]._M_nxt)(&local_408,local_338,local_2c8);
  local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_408._M_pi;
  local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_400;
  local_408._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pbStack_400 = (pointer)0x0;
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"raw H264 file","");
  pOVar3 = cxxopts::OptionAdder::operator()(pOVar3,&local_388,&local_3a8,&local_328,&local_3c8);
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"help","");
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"Print help","");
  cxxopts::value<bool>();
  local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_418;
  local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_410;
  local_418 = (element_type *)0x0;
  p_Stack_410 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"");
  cxxopts::OptionAdder::operator()(pOVar3,&local_3e8,&local_2e8,&local_348,&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if (local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_348.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_410 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_410);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if (local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_328.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (pbStack_400 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_400);
  }
  if (local_2c8[0] != local_2b8) {
    operator_delete(local_2c8[0],local_2b8[0] + 1);
  }
  if (local_330 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_330);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if (local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_318.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (pbStack_3f0 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_3f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_pathname._M_dataplus._M_p != &local_508._M_pathname.field_2) {
    operator_delete(local_508._M_pathname._M_dataplus._M_p,
                    local_508._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((uint *)local_268._0_8_ != puVar1) {
    operator_delete((void *)local_268._0_8_,stack0xfffffffffffffda8 + 1);
  }
  if ((undefined1 *)local_4b8._8_8_ != local_4a8 + 8) {
    operator_delete((void *)local_4b8._8_8_,local_4a8._8_8_ + 1);
  }
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8,CONCAT44(uStack_4c4,local_4c8) + 1);
  }
  local_4b8._0_8_ = local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"input","");
  plVar7 = (long *)local_488;
  aStack_498._M_allocated_capacity = (size_type)plVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&aStack_498,"output","");
  options_00._M_len = 2;
  options_00._M_array = (iterator)local_4b8;
  cxxopts::Options::parse_positional(&local_1a8,options_00);
  lVar8 = -0x40;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    plVar7 = plVar7 + -4;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  local_4b8._8_8_ = &local_1a8.m_positional;
  local_488._0_8_ = local_458;
  local_4b8._0_8_ =
       local_1a8.m_options.
       super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  local_4a8._0_8_ = (pointer)0x0;
  local_4a8._8_8_ = 0;
  aStack_498._0_8_ = 0;
  aStack_498._M_local_buf[8] = local_1a8.m_allow_unrecognised;
  local_488._8_8_ = 1;
  local_488._16_8_ = 0;
  local_488._24_8_ = 0;
  local_468._M_p = (pointer)0x3f800000;
  local_458._8_8_ = &local_420;
  sStack_460 = 0;
  local_458._0_8_ = 0;
  _Stack_448._M_p = (pointer)0x1;
  local_440._M_nxt = (_Hash_node_base *)0x0;
  aStack_438._M_allocated_capacity = 0;
  aStack_438._8_8_ = 0x3f800000;
  sStack_428 = 0;
  local_420 = (__node_base_ptr)0x0;
  cxxopts::OptionParser::parse((ParseResult *)local_268,(OptionParser *)local_4b8,argc,argv);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_458 + 8));
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_488);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)local_4a8);
  local_4b8._0_8_ = (Options *)local_4a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"help","");
  sVar4 = cxxopts::ParseResult::count((ParseResult *)local_268,(string *)local_4b8);
  if ((Options *)local_4b8._0_8_ != (Options *)local_4a8) {
    operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
  }
  if (sVar4 == 0) {
    local_4b8._0_8_ = (Options *)local_4a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"input","");
    sVar4 = cxxopts::ParseResult::count((ParseResult *)local_268,(string *)local_4b8);
    if ((Options *)local_4b8._0_8_ != (Options *)local_4a8) {
      operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
    }
    if (sVar4 != 0) {
      local_4b8._0_8_ = (Options *)local_4a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"input","");
      pOVar5 = cxxopts::ParseResult::operator[]((ParseResult *)local_268,(string *)local_4b8);
      __source = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar5);
      if ((Options *)local_4b8._0_8_ != (Options *)local_4a8) {
        operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
      }
      local_4b8._0_8_ = (Options *)local_4a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"output","");
      pOVar5 = cxxopts::ParseResult::operator[]((ParseResult *)local_268,(string *)local_4b8);
      __source_00 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar5);
      if ((Options *)local_4b8._0_8_ != (Options *)local_4a8) {
        operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._0_8_ + 1));
      }
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)local_4b8,__source,auto_format);
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                (&local_508,__source_00,auto_format);
      ani::extract_ani_frames((path *)local_4b8,&local_508);
      std::filesystem::__cxx11::path::~path(&local_508);
      std::filesystem::__cxx11::path::~path((path *)local_4b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1e0);
      std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_1f8);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_230);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_268);
      cxxopts::Options::~Options(&local_1a8);
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Specify input file",0x12);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    local_508._M_pathname._M_dataplus._M_p = (pointer)0x0;
    local_508._M_pathname._M_string_length = 0;
    local_508._M_pathname.field_2._M_allocated_capacity = 0;
    cxxopts::Options::help
              ((string *)local_4b8,&local_1a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_508);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_4b8._0_8_,local_4b8._8_8_);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    local_508._M_pathname._M_dataplus._M_p = (pointer)0x0;
    local_508._M_pathname._M_string_length = 0;
    local_508._M_pathname.field_2._M_allocated_capacity = 0;
    cxxopts::Options::help
              ((string *)local_4b8,&local_1a8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_508);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_4b8._0_8_,local_4b8._8_8_);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::__cxx11::string::~string((string *)local_4b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_508);
  exit(0);
}

Assistant:

void parse(int argc, const char* argv[])
{
    try
    {
        cxxopts::Options options(argv[0], " - ani files to h264 bitstream converter");
        options
                .positional_help("[optional args]")
                .show_positional_help();

        options
                .set_width(70)
                .set_tab_expansion()
                .allow_unrecognised_options()
                .add_options()
                        ("i,input", "Input", cxxopts::value<std::string>(), "ANI file")
                        ("o,output", "Output file", cxxopts::value<std::string>()
                                ->default_value("out.h264"), "raw H264 file")
                        ("help", "Print help");

        options.parse_positional({"input", "output"});

        auto result = options.parse(argc, argv);

        if (result.count("help"))
        {
            std::cout << options.help() << std::endl;
            exit(0);
        }

        if (!result.count("input"))
        {
            std::cout << "Specify input file" << std::endl;
            std::cout << options.help() << std::endl;
            exit(0);
        }

        const auto &input = result["input"].as<std::string>();
        const auto &output = result["output"].as<std::string>();

        ani::extract_ani_frames(input, output);

    }
    catch (const cxxopts::OptionException& e)
    {
        std::cout << "error parsing options: " << e.what() << std::endl;
        exit(1);
    }
}